

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

TestNode *
deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,Vec4 *scissorArea,
          Vec4 *renderArea,PrimitiveType type,int primitiveCount)

{
  pointer pcVar1;
  size_type sVar2;
  TestNode *this;
  
  this = (TestNode *)operator_new(0xa0);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,desc);
  ((TestNode *)&this[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)renderCtx;
  pcVar1 = *(pointer *)(scissorArea->m_data + 2);
  this[1].m_testCtx = *(TestContext **)scissorArea->m_data;
  this[1].m_name._M_dataplus._M_p = pcVar1;
  ((TestNode *)&this->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_007832b0;
  sVar2 = *(size_type *)(renderArea->m_data + 2);
  this[1].m_name._M_string_length = *(size_type *)renderArea->m_data;
  this[1].m_name.field_2._M_allocated_capacity = sVar2;
  *(PrimitiveType *)((long)&this[1].m_name.field_2 + 8) = type;
  *(int *)((long)&this[1].m_name.field_2 + 0xc) = primitiveCount;
  return this;
}

Assistant:

tcu::TestNode* createPrimitiveTest (tcu::TestContext&	testCtx,
									glu::RenderContext&	renderCtx,
									const char*			name,
									const char*			desc,
									const Vec4&			scissorArea,
									const Vec4&			renderArea,
									PrimitiveType		type,
									int					primitiveCount)
{
	return new ScissorPrimitiveCase(testCtx, renderCtx, name, desc, scissorArea, renderArea, type, primitiveCount);
}